

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

void luaT_init(lua_State *L)

{
  TString *pTVar1;
  int local_14;
  int i;
  lua_State *L_local;
  
  local_14 = 0;
  while( true ) {
    if (0x17 < local_14) {
      return;
    }
    pTVar1 = luaS_new(L,luaT_init::luaT_eventname[local_14]);
    L->l_G->tmname[local_14] = pTVar1;
    if (9 < (L->l_G->tmname[local_14]->tt & 0xf)) break;
    luaC_fix(L,(GCObject *)L->l_G->tmname[local_14]);
    local_14 = local_14 + 1;
  }
  __assert_fail("((((L->l_G)->tmname[i])->tt) & 0x0F) < (9+1)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                ,0x32,"void luaT_init(lua_State *)");
}

Assistant:

void luaT_init (lua_State *L) {
  static const char *const luaT_eventname[] = {  /* ORDER TM */
    "__index", "__newindex",
    "__gc", "__mode", "__len", "__eq",
    "__add", "__sub", "__mul", "__mod", "__pow",
    "__div", "__idiv",
    "__band", "__bor", "__bxor", "__shl", "__shr",
    "__unm", "__bnot", "__lt", "__le",
    "__concat", "__call"
  };
  int i;
  for (i=0; i<TM_N; i++) {
    G(L)->tmname[i] = luaS_new(L, luaT_eventname[i]);
    luaC_fix(L, obj2gco(G(L)->tmname[i]));  /* never collect these names */
  }
}